

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O3

void HTS_Vocoder_synthesize
               (HTS_Vocoder *v,size_t m,double lf0,double *spectrum,size_t nlpf,double *lpf,
               double alpha,double beta,double volume,double *rawdata,HTS_Audio *audio)

{
  double *pdVar1;
  bool bVar2;
  short data;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  double *pdVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  size_t sVar10;
  double *pdVar11;
  uint m_00;
  ulong uVar12;
  double *pdVar13;
  ulong uVar14;
  int iVar15;
  double *pdVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  double *pdVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  double *pdVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  int local_bc;
  
  dVar33 = 0.0;
  if ((lf0 != -10000000000.0) || (NAN(lf0))) {
    if (lf0 <= 2.995732273553991) {
      dVar33 = v->rate / 20.0;
    }
    else {
      dVar33 = v->rate;
      if (9.903487552536127 <= lf0) {
        dVar33 = dVar33 / 20000.0;
      }
      else {
        dVar26 = exp(lf0);
        dVar33 = dVar33 / dVar26;
      }
    }
  }
  m_00 = (uint)m;
  if (v->is_first == '\x01') {
    v->pitch_of_curr_point = dVar33;
    v->pitch_counter = dVar33;
    v->pitch_inc_per_point = 0.0;
    if (nlpf == 0) {
      v->excite_ring_buff = (double *)0x0;
      v->excite_buff_size = 0;
      v->excite_buff_index = 0;
    }
    else {
      v->excite_buff_size = nlpf;
      pdVar3 = (double *)HTS_calloc(nlpf,8);
      v->excite_ring_buff = pdVar3;
      if (v->excite_buff_size != 0) {
        memset(pdVar3,0,v->excite_buff_size << 3);
      }
      v->excite_buff_index = 0;
    }
    pdVar3 = v->c;
    if (v->stage == 0) {
      HTS_mc2b(spectrum,pdVar3,m_00,alpha);
    }
    else {
      iVar7 = m_00 + 1;
      lVar4 = (long)iVar7;
      if (pdVar3 < spectrum) {
        if (iVar7 != 0) {
          lVar9 = 0;
          do {
            pdVar3[lVar9] = spectrum[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar4 != lVar9);
        }
      }
      else if (iVar7 != 0) {
        do {
          pdVar3[lVar4 + -1] = spectrum[lVar4 + -1];
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      HTS_lsp2mgc(v,pdVar3,pdVar3,m_00,alpha);
      pdVar3 = v->c;
      if ((0 < (int)m_00) && ((alpha != 0.0 || (NAN(alpha))))) {
        dVar26 = pdVar3[m_00 & 0x7fffffff];
        uVar5 = (ulong)(m_00 & 0x7fffffff) + 1;
        do {
          dVar26 = dVar26 * -alpha + pdVar3[uVar5 - 2];
          pdVar3[uVar5 - 2] = dVar26;
          uVar5 = uVar5 - 1;
        } while (1 < uVar5);
      }
      HTS_gnorm(pdVar3,pdVar3,m_00,v->gamma);
      if (m != 0) {
        pdVar3 = v->c;
        sVar10 = 0;
        do {
          pdVar3[sVar10 + 1] = v->gamma * pdVar3[sVar10 + 1];
          sVar10 = sVar10 + 1;
        } while (m != sVar10);
      }
    }
    v->is_first = '\0';
  }
  dVar26 = 0.0;
  if ((dVar33 != 0.0) || (NAN(dVar33))) {
    dVar27 = v->pitch_of_curr_point;
    if ((dVar27 == 0.0) && (!NAN(dVar27))) goto LAB_0017dd7f;
    auVar29._0_8_ = (double)CONCAT44(0x43300000,(int)v->fprd);
    auVar29._8_4_ = (int)(v->fprd >> 0x20);
    auVar29._12_4_ = 0x45300000;
    dVar26 = (dVar33 - dVar27) /
             ((auVar29._8_8_ - 1.9342813113834067e+25) + (auVar29._0_8_ - 4503599627370496.0));
  }
  else {
LAB_0017dd7f:
    v->pitch_of_curr_point = dVar33;
    v->pitch_counter = dVar33;
  }
  v->pitch_inc_per_point = dVar26;
  if (v->stage != 0) {
    if ((1 < m) && (0.0 < beta)) {
      if (v->postfilter_size < m) {
        if (v->postfilter_buff != (double *)0x0) {
          HTS_free(v->postfilter_buff);
        }
        pdVar3 = (double *)HTS_calloc(m + 1,8);
        v->postfilter_buff = pdVar3;
        v->postfilter_size = m;
      }
      dVar26 = HTS_lsp2en(v,spectrum,m,alpha);
      pdVar3 = v->postfilter_buff;
      uVar5 = 0;
      do {
        if (uVar5 < m && 1 < uVar5) {
          dVar27 = spectrum[uVar5 - 1];
          dVar35 = spectrum[uVar5];
          dVar36 = (spectrum + uVar5)[1];
          dVar34 = (dVar35 - dVar27) * beta;
          dVar35 = (dVar36 - dVar35) * beta;
          dVar27 = (((dVar36 - dVar27) - (dVar35 + dVar34)) * dVar34 * dVar34) /
                   (dVar35 * dVar35 + dVar34 * dVar34) + dVar27 + dVar34;
        }
        else {
          dVar27 = spectrum[uVar5];
        }
        pdVar3[uVar5] = dVar27;
        uVar5 = uVar5 + 1;
      } while (m + 1 + (ulong)(m + 1 == 0) != uVar5);
      iVar7 = m_00 + 1;
      lVar4 = (long)iVar7;
      if (spectrum < pdVar3) {
        if (iVar7 != 0) {
          lVar9 = 0;
          do {
            spectrum[lVar9] = pdVar3[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar4 != lVar9);
        }
      }
      else if (iVar7 != 0) {
        do {
          spectrum[lVar4 + -1] = pdVar3[lVar4 + -1];
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      dVar27 = HTS_lsp2en(v,spectrum,m,alpha);
      if ((dVar26 != dVar27) || (NAN(dVar26) || NAN(dVar27))) {
        dVar26 = dVar26 / dVar27;
        if (v->use_log_gain == '\0') {
          if (dVar26 < 0.0) {
            dVar26 = sqrt(dVar26);
          }
          else {
            dVar26 = SQRT(dVar26);
          }
          dVar26 = dVar26 * *spectrum;
        }
        else {
          dVar26 = log(dVar26);
          dVar26 = dVar26 * 0.5 + *spectrum;
        }
        *spectrum = dVar26;
      }
    }
    lVar4 = m + 1;
    auVar28._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar28._0_8_ = lVar4;
    auVar28._12_4_ = 0x45300000;
    dVar26 = 0.7853981633974483 /
             ((auVar28._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
    uVar5 = 0;
    do {
      dVar27 = spectrum[1];
      if (m < 2) {
        bVar2 = false;
      }
      else {
        sVar10 = 1;
        bVar2 = false;
        do {
          dVar35 = spectrum[sVar10 + 1];
          if (dVar35 - dVar27 < dVar26) {
            dVar36 = dVar26 - (dVar35 - dVar27);
            dVar35 = dVar36 * 0.5 + dVar35;
            spectrum[sVar10] = dVar36 * -0.5 + dVar27;
            (spectrum + sVar10)[1] = dVar35;
            bVar2 = true;
          }
          dVar27 = dVar35;
          sVar10 = sVar10 + 1;
        } while (m != sVar10);
        dVar27 = spectrum[1];
      }
      if (dVar27 < dVar26) {
        spectrum[1] = dVar26;
        bVar2 = true;
      }
      if (spectrum[m] <= 3.141592653589793 - dVar26) {
        if (!bVar2) goto LAB_0017e293;
      }
      else {
        spectrum[m] = 3.141592653589793 - dVar26;
      }
      if (2 < uVar5) goto LAB_0017e293;
      uVar5 = uVar5 + 1;
    } while( true );
  }
  if ((1 < (int)m_00) && (0.0 < beta)) {
    pdVar3 = v->postfilter_buff;
    uVar5 = (ulong)(m_00 & 0x7fffffff);
    if (v->postfilter_size < uVar5) {
      if (pdVar3 != (double *)0x0) {
        HTS_free(pdVar3);
      }
      uVar14 = m + 1 & 0xffffffff;
      pdVar3 = (double *)HTS_calloc(uVar14,8);
      v->postfilter_buff = pdVar3;
      v->postfilter_size = uVar5;
    }
    else {
      uVar14 = m + 1 & 0xffffffff;
    }
    HTS_mc2b(spectrum,pdVar3,m_00,alpha);
    dVar26 = HTS_b2en(v,v->postfilter_buff,m_00,alpha);
    pdVar3 = v->postfilter_buff;
    pdVar3[1] = pdVar3[1] - beta * alpha * pdVar3[2];
    uVar19 = 2;
    do {
      pdVar3[uVar19] = pdVar3[uVar19] * (beta + 1.0);
      uVar19 = uVar19 + 1;
    } while (uVar14 != uVar19);
    dVar27 = HTS_b2en(v,pdVar3,m_00,alpha);
    dVar26 = log(dVar26 / dVar27);
    pdVar3 = v->postfilter_buff;
    *pdVar3 = dVar26 * 0.5 + *pdVar3;
    dVar26 = pdVar3[uVar5];
    spectrum[uVar5] = dVar26;
    uVar5 = uVar5 + 1;
    do {
      dVar27 = pdVar3[uVar5 - 2];
      spectrum[uVar5 - 2] = dVar26 * alpha + dVar27;
      uVar5 = uVar5 - 1;
      dVar26 = dVar27;
    } while (1 < uVar5);
  }
  HTS_mc2b(spectrum,v->cc,m_00,alpha);
  pdVar3 = v->cc;
  sVar10 = v->fprd;
  auVar30._8_4_ = (int)(sVar10 >> 0x20);
  auVar30._0_8_ = sVar10;
  auVar30._12_4_ = 0x45300000;
  pdVar6 = v->c;
  pdVar1 = v->cinc;
  lVar4 = 0;
  do {
    pdVar1[lVar4] =
         (pdVar3[lVar4] - pdVar6[lVar4]) /
         ((auVar30._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)sVar10) - 4503599627370496.0));
    lVar4 = lVar4 + 1;
  } while (m + 1 != lVar4);
LAB_0017e3a4:
  pdVar1 = &v->pitch_of_curr_point;
  if (sVar10 == 0) {
    lVar4 = (long)((m << 0x20) + 0x100000000) >> 0x20;
  }
  else {
    dVar26 = 1.0 - alpha * alpha;
    lVar18 = (m << 0x20) + 0x100000000;
    lVar4 = lVar18 >> 0x20;
    iVar7 = m_00 + 2;
    uVar14 = m + 1 & 0xffffffff;
    lVar9 = (long)iVar7;
    lVar24 = uVar14 - 2;
    uVar5 = 0;
    local_bc = 0;
    do {
      if (v->excite_buff_size == 0) {
        dVar27 = *pdVar1;
        if ((dVar27 != 0.0) || (NAN(dVar27))) {
          dVar36 = v->pitch_counter + 1.0;
          v->pitch_counter = dVar36;
          dVar35 = 0.0;
          if (dVar27 <= dVar36) {
            if (dVar27 < 0.0) {
              dVar35 = sqrt(dVar27);
            }
            else {
              dVar35 = SQRT(dVar27);
            }
            dVar27 = v->pitch_of_curr_point;
            v->pitch_counter = v->pitch_counter - dVar27;
          }
          v->pitch_of_curr_point = dVar27 + v->pitch_inc_per_point;
        }
        else {
          dVar35 = HTS_white_noise(v);
        }
      }
      else {
        dVar35 = HTS_white_noise(v);
        dVar27 = v->pitch_of_curr_point;
        if ((dVar27 != 0.0) || (NAN(dVar27))) {
          dVar34 = v->pitch_counter + 1.0;
          v->pitch_counter = dVar34;
          dVar36 = 0.0;
          if (dVar27 <= dVar34) {
            if (dVar27 < 0.0) {
              dVar36 = sqrt(dVar27);
            }
            else {
              dVar36 = SQRT(dVar27);
            }
            v->pitch_counter = v->pitch_counter - v->pitch_of_curr_point;
          }
          pdVar3 = v->excite_ring_buff;
          uVar19 = v->excite_buff_size;
          sVar10 = v->excite_buff_index;
          if (dVar35 != 0.0 && uVar19 != 0) {
            uVar23 = 0;
            do {
              dVar27 = 1.0;
              if (uVar19 - 1 >> 1 != uVar23) {
                dVar27 = 0.0;
              }
              uVar12 = (sVar10 + uVar23) % uVar19;
              pdVar3[uVar12] = (dVar27 - lpf[uVar23]) * dVar35 + pdVar3[uVar12];
              uVar23 = uVar23 + 1;
            } while (uVar19 != uVar23);
          }
          if (dVar36 != 0.0 && uVar19 != 0) {
            uVar23 = 0;
            do {
              uVar12 = (sVar10 + uVar23) % uVar19;
              pdVar3[uVar12] = lpf[uVar23] * dVar36 + pdVar3[uVar12];
              uVar23 = uVar23 + 1;
            } while (uVar19 != uVar23);
          }
          dVar35 = v->pitch_inc_per_point;
          pdVar6 = pdVar1;
        }
        else {
          pdVar3 = v->excite_ring_buff;
          uVar19 = v->excite_buff_size;
          sVar10 = v->excite_buff_index;
          pdVar6 = pdVar3 + ((uVar19 - 1 >> 1) + sVar10) % uVar19;
        }
        *pdVar6 = dVar35 + *pdVar6;
        dVar35 = pdVar3[sVar10];
        pdVar3[sVar10] = 0.0;
        sVar10 = sVar10 + 1;
        if (uVar19 <= sVar10) {
          sVar10 = 0;
        }
        v->excite_buff_index = sVar10;
      }
      if (v->stage == 0) {
        pdVar6 = v->c;
        if ((dVar35 != 0.0) || (NAN(dVar35))) {
          dVar27 = exp(*pdVar6);
          dVar35 = dVar35 * dVar27;
          pdVar6 = v->c;
        }
        pdVar3 = v->d1;
        dVar27 = 0.0;
        lVar21 = 0;
        do {
          uVar19 = lVar21 + 5;
          dVar34 = pdVar3[lVar21 + 10] * dVar26 + pdVar3[lVar21 + 5] * alpha;
          pdVar3[lVar21 + 5] = dVar34;
          dVar34 = dVar34 * pdVar6[1];
          pdVar3[lVar21 + 0xb] = dVar34;
          dVar34 = dVar34 * HTS_pade[lVar21 + 0x14];
          dVar36 = dVar34;
          if ((uVar19 & 1) == 0) {
            dVar36 = -dVar34;
          }
          dVar35 = dVar35 + dVar36;
          dVar27 = dVar27 + dVar34;
          lVar21 = lVar21 + -1;
        } while (1 < uVar19);
        pdVar3[6] = dVar35;
        dVar27 = dVar27 + dVar35;
        pdVar13 = pdVar3 + (long)(iVar7 * 5) + 0xc;
        pdVar20 = pdVar3 + lVar9 * 4 + 0xf;
        pdVar16 = pdVar3 + lVar9 * 4 + 0xe;
        pdVar25 = pdVar3 + uVar14 + lVar9 * 4 + 0xc;
        dVar35 = 0.0;
        lVar21 = 0;
        uVar19 = 5;
        do {
          lVar22 = (uVar19 - 1) * lVar9;
          dVar36 = pdVar13[uVar19 - 1];
          pdVar3[lVar22 + 0xc] = dVar36;
          pdVar3[lVar22 + 0xd] = dVar36 * dVar26 + pdVar3[lVar22 + 0xd] * alpha;
          dVar36 = 0.0;
          if (1 < (int)m_00) {
            dVar36 = *(double *)((long)pdVar3 + lVar9 * -8 * lVar21 + lVar9 * 0x20 + 0x68);
            lVar17 = 0;
            dVar34 = pdVar3[lVar22 + 0xe];
            do {
              pdVar11 = pdVar20 + lVar17;
              dVar36 = (*pdVar11 - dVar36) * alpha + dVar34;
              pdVar20[lVar17 + -1] = dVar36;
              lVar17 = lVar17 + 1;
              dVar34 = *pdVar11;
            } while (lVar24 != lVar17);
            dVar36 = 0.0;
            lVar22 = 0;
            do {
              dVar36 = dVar36 + pdVar16[lVar22] * pdVar6[lVar22 + 2];
              lVar22 = lVar22 + 1;
            } while (lVar24 != lVar22);
          }
          pdVar11 = pdVar25;
          iVar15 = iVar7;
          if (0 < (int)m_00) {
            do {
              *pdVar11 = pdVar11[-1];
              iVar15 = iVar15 + -1;
              pdVar11 = pdVar11 + -1;
            } while (2 < iVar15);
          }
          pdVar13[uVar19] = dVar36;
          dVar36 = dVar36 * HTS_pade[uVar19 + 0xf];
          dVar34 = dVar36;
          if ((uVar19 & 1) == 0) {
            dVar34 = -dVar36;
          }
          dVar27 = dVar27 + dVar34;
          dVar35 = dVar35 + dVar36;
          lVar21 = lVar21 + 1;
          pdVar20 = pdVar20 + -lVar9;
          pdVar16 = pdVar16 + -lVar9;
          pdVar25 = pdVar25 + -lVar9;
          bVar2 = 1 < uVar19;
          uVar19 = uVar19 - 1;
        } while (bVar2);
        *pdVar13 = dVar27;
        dVar35 = dVar35 + dVar27;
      }
      else {
        pdVar6 = v->c;
        dVar35 = dVar35 * *pdVar6;
        uVar8 = (uint)v->stage;
        if (0 < (int)uVar8) {
          pdVar20 = v->d1;
          pdVar3 = pdVar20 + 2;
          uVar19 = 0;
          pdVar16 = pdVar20;
          do {
            lVar21 = uVar19 * lVar4;
            dVar27 = pdVar20[lVar21];
            dVar36 = pdVar6[1] * dVar27;
            if (1 < (int)m_00) {
              dVar34 = *(double *)((long)pdVar20 + (lVar18 >> 0x1d) * uVar19);
              lVar22 = 0;
              dVar32 = pdVar20[lVar21 + 1];
              do {
                pdVar13 = pdVar3 + lVar22;
                dVar34 = (*pdVar13 - dVar34) * alpha + dVar32;
                pdVar3[lVar22 + -1] = dVar34;
                dVar36 = dVar36 + pdVar6[lVar22 + 2] * dVar34;
                lVar22 = lVar22 + 1;
                dVar32 = *pdVar13;
              } while ((m & 0xffffffff) - 1 != lVar22);
            }
            uVar23 = (m & 0xffffffff) + 1;
            if (0 < (int)m_00) {
              do {
                pdVar16[uVar23 - 1] = pdVar16[uVar23 - 2];
                uVar23 = uVar23 - 1;
              } while (1 < uVar23);
            }
            dVar35 = dVar35 - dVar36;
            pdVar20[lVar21] = dVar27 * alpha + dVar26 * dVar35;
            uVar19 = uVar19 + 1;
            pdVar3 = pdVar3 + lVar4;
            pdVar16 = pdVar16 + lVar4;
          } while (uVar19 != (uVar8 & 0x7fffffff));
        }
      }
      dVar35 = dVar35 * volume;
      if (rawdata != (double *)0x0) {
        lVar21 = (long)local_bc;
        local_bc = local_bc + 1;
        rawdata[lVar21] = dVar35;
      }
      if (audio != (HTS_Audio *)0x0) {
        data = 0x7fff;
        if ((dVar35 <= 32767.0) && (data = -0x8000, -32768.0 <= dVar35)) {
          data = (short)(int)dVar35;
        }
        HTS_Audio_write(audio,data);
        pdVar6 = v->c;
      }
      pdVar3 = v->cinc;
      uVar19 = 0;
      do {
        pdVar6[uVar19] = pdVar3[uVar19] + pdVar6[uVar19];
        uVar19 = uVar19 + 1;
      } while (m + 1 != uVar19);
      uVar5 = uVar5 + 1;
    } while (uVar5 < v->fprd);
    pdVar3 = v->cc;
  }
  *pdVar1 = dVar33;
  if (pdVar6 < pdVar3) {
    lVar9 = 0;
    do {
      pdVar6[lVar9] = pdVar3[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar4 != lVar9);
  }
  else {
    do {
      pdVar6[lVar4 + -1] = pdVar3[lVar4 + -1];
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  return;
LAB_0017e293:
  HTS_lsp2mgc(v,spectrum,v->cc,m_00,alpha);
  pdVar3 = v->cc;
  if ((0 < (int)m_00) && ((alpha != 0.0 || (NAN(alpha))))) {
    dVar26 = pdVar3[m_00 & 0x7fffffff];
    uVar5 = (ulong)(m_00 & 0x7fffffff) + 1;
    do {
      dVar26 = dVar26 * -alpha + pdVar3[uVar5 - 2];
      pdVar3[uVar5 - 2] = dVar26;
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
  }
  HTS_gnorm(pdVar3,pdVar3,m_00,v->gamma);
  pdVar3 = v->cc;
  if (m != 0) {
    sVar10 = 0;
    do {
      pdVar3[sVar10 + 1] = v->gamma * pdVar3[sVar10 + 1];
      sVar10 = sVar10 + 1;
    } while (m != sVar10);
  }
  sVar10 = v->fprd;
  auVar31._8_4_ = (int)(sVar10 >> 0x20);
  auVar31._0_8_ = sVar10;
  auVar31._12_4_ = 0x45300000;
  pdVar6 = v->c;
  pdVar1 = v->cinc;
  lVar9 = 0;
  do {
    pdVar1[lVar9] =
         (pdVar3[lVar9] - pdVar6[lVar9]) /
         ((auVar31._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)sVar10) - 4503599627370496.0));
    lVar9 = lVar9 + 1;
  } while (lVar4 != lVar9);
  goto LAB_0017e3a4;
}

Assistant:

void HTS_Vocoder_synthesize(HTS_Vocoder * v, size_t m, double lf0, double *spectrum, size_t nlpf, double *lpf, double alpha, double beta, double volume, double *rawdata, HTS_Audio * audio)
{
   double x;
   int i, j;
   short xs;
   int rawidx = 0;
   double p;

   /* lf0 -> pitch */
   if (lf0 == LZERO)
      p = 0.0;
   else if (lf0 <= MIN_LF0)
      p = v->rate / MIN_F0;
   else if (lf0 >= MAX_LF0)
      p = v->rate / MAX_F0;
   else
      p = v->rate / exp(lf0);

   /* first time */
   if (v->is_first == TRUE) {
      HTS_Vocoder_initialize_excitation(v, p, nlpf);
      if (v->stage == 0) {      /* for MCP */
         HTS_mc2b(spectrum, v->c, m, alpha);
      } else {                  /* for LSP */
         HTS_movem(spectrum, v->c, m + 1);
         HTS_lsp2mgc(v, v->c, v->c, m, alpha);
         HTS_mc2b(v->c, v->c, m, alpha);
         HTS_gnorm(v->c, v->c, m, v->gamma);
         for (i = 1; i <= m; i++)
            v->c[i] *= v->gamma;
      }
      v->is_first = FALSE;
   }

   HTS_Vocoder_start_excitation(v, p);
   if (v->stage == 0) {         /* for MCP */
      HTS_Vocoder_postfilter_mcp(v, spectrum, m, alpha, beta);
      HTS_mc2b(spectrum, v->cc, m, alpha);
      for (i = 0; i <= m; i++)
         v->cinc[i] = (v->cc[i] - v->c[i]) / v->fprd;
   } else {                     /* for LSP */
      HTS_Vocoder_postfilter_lsp(v, spectrum, m, alpha, beta);
      HTS_check_lsp_stability(spectrum, m);
      HTS_lsp2mgc(v, spectrum, v->cc, m, alpha);
      HTS_mc2b(v->cc, v->cc, m, alpha);
      HTS_gnorm(v->cc, v->cc, m, v->gamma);
      for (i = 1; i <= m; i++)
         v->cc[i] *= v->gamma;
      for (i = 0; i <= m; i++)
         v->cinc[i] = (v->cc[i] - v->c[i]) / v->fprd;
   }

   for (j = 0; j < v->fprd; j++) {
      x = HTS_Vocoder_get_excitation(v, lpf);
      if (v->stage == 0) {      /* for MCP */
         if (x != 0.0)
            x *= exp(v->c[0]);
         x = HTS_mlsadf(x, v->c, m, alpha, PADEORDER, v->d1);
      } else {                  /* for LSP */
         if (!NGAIN)
            x *= v->c[0];
         x = HTS_mglsadf(x, v->c, m, alpha, v->stage, v->d1);
      }
      x *= volume;

      /* output */
      if (rawdata)
         rawdata[rawidx++] = x;
      if (audio) {
         if (x > 32767.0)
            xs = 32767;
         else if (x < -32768.0)
            xs = -32768;
         else
            xs = (short) x;
         HTS_Audio_write(audio, xs);
      }

      for (i = 0; i <= m; i++)
         v->c[i] += v->cinc[i];
   }

   HTS_Vocoder_end_excitation(v, p);
   HTS_movem(v->cc, v->c, m + 1);
}